

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot.cpp
# Opt level: O2

void __thiscall
CSnapshotStorage::Add
          (CSnapshotStorage *this,int Tick,int64 Tagtime,int DataSize,void *pData,bool CreateAlt)

{
  CHolder *pCVar1;
  int iVar2;
  CHolder *pCVar3;
  CSnapshotStorage *pCVar4;
  CSnapshot *dest;
  undefined3 in_register_00000089;
  
  iVar2 = DataSize;
  if (CONCAT31(in_register_00000089,CreateAlt) == 0) {
    iVar2 = 0;
  }
  pCVar3 = (CHolder *)mem_alloc(DataSize + iVar2 + 0x30);
  pCVar3->m_Tick = Tick;
  pCVar3->m_Tagtime = Tagtime;
  pCVar3->m_SnapSize = DataSize;
  pCVar3->m_pSnap = (CSnapshot *)(pCVar3 + 1);
  mem_copy(pCVar3 + 1,pData,DataSize);
  if (CONCAT31(in_register_00000089,CreateAlt) == 0) {
    pCVar3->m_pAltSnap = (CSnapshot *)0x0;
  }
  else {
    dest = (CSnapshot *)((long)&pCVar3->m_pSnap->m_DataSize + (long)DataSize);
    pCVar3->m_pAltSnap = dest;
    mem_copy(dest,pData,DataSize);
  }
  pCVar3->m_pNext = (CHolder *)0x0;
  pCVar1 = this->m_pLast;
  pCVar3->m_pPrev = pCVar1;
  pCVar4 = (CSnapshotStorage *)&pCVar1->m_pNext;
  if (pCVar1 == (CHolder *)0x0) {
    pCVar4 = this;
  }
  pCVar4->m_pFirst = pCVar3;
  this->m_pLast = pCVar3;
  return;
}

Assistant:

void CSnapshotStorage::Add(int Tick, int64 Tagtime, int DataSize, const void *pData, bool CreateAlt)
{
	// allocate memory for holder + snapshot_data
	int TotalSize = sizeof(CHolder)+DataSize;

	if(CreateAlt)
		TotalSize += DataSize;

	CHolder *pHolder = (CHolder *)mem_alloc(TotalSize);

	// set data
	pHolder->m_Tick = Tick;
	pHolder->m_Tagtime = Tagtime;
	pHolder->m_SnapSize = DataSize;
	pHolder->m_pSnap = (CSnapshot*)(pHolder+1);
	mem_copy(pHolder->m_pSnap, pData, DataSize);

	if(CreateAlt) // create alternative if wanted
	{
		pHolder->m_pAltSnap = (CSnapshot*)(((char *)pHolder->m_pSnap) + DataSize);
		mem_copy(pHolder->m_pAltSnap, pData, DataSize);
	}
	else
		pHolder->m_pAltSnap = 0;


	// link
	pHolder->m_pNext = 0;
	pHolder->m_pPrev = m_pLast;
	if(m_pLast)
		m_pLast->m_pNext = pHolder;
	else
		m_pFirst = pHolder;
	m_pLast = pHolder;
}